

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode decode_host(dynbuf *host)

{
  CURLcode CVar1;
  char *__s;
  char *pcVar2;
  CURLUcode CVar3;
  char *decoded;
  size_t dlen;
  char *local_28;
  size_t local_20;
  
  __s = Curl_dyn_ptr(host);
  CVar3 = CURLUE_OK;
  if (*__s != '[') {
    pcVar2 = strchr(__s,0x25);
    CVar3 = CURLUE_OK;
    if (pcVar2 != (char *)0x0) {
      CVar1 = Curl_urldecode(__s,0,&local_28,&local_20,REJECT_CTRL);
      CVar3 = CURLUE_BAD_HOSTNAME;
      if (CVar1 == CURLE_OK) {
        Curl_dyn_reset(host);
        CVar1 = Curl_dyn_addn(host,local_28,local_20);
        (*Curl_cfree)(local_28);
        CVar3 = CURLUE_OUT_OF_MEMORY;
        if (CVar1 == CURLE_OK) {
          CVar3 = CURLUE_OK;
        }
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLUcode decode_host(struct dynbuf *host)
{
  char *per = NULL;
  const char *hostname = Curl_dyn_ptr(host);
  if(hostname[0] == '[')
    /* only decode if not an ipv6 numerical */
    return CURLUE_OK;
  per = strchr(hostname, '%');
  if(!per)
    /* nothing to decode */
    return CURLUE_OK;
  else {
    /* encoded */
    size_t dlen;
    char *decoded;
    CURLcode result = Curl_urldecode(hostname, 0, &decoded, &dlen,
                                     REJECT_CTRL);
    if(result)
      return CURLUE_BAD_HOSTNAME;
    Curl_dyn_reset(host);
    result = Curl_dyn_addn(host, decoded, dlen);
    free(decoded);
    if(result)
      return CURLUE_OUT_OF_MEMORY;
  }

  return CURLUE_OK;
}